

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_string.c
# Opt level: O2

void test_cio_memmem(void)

{
  void *pvVar1;
  size_t needlelen;
  char needle_not_found [2];
  char needle_found [2];
  char haystack [5];
  
  builtin_strncpy(haystack,"abcd",5);
  needle_found[0] = 'a';
  needle_found[1] = '\0';
  pvVar1 = cio_memmem(haystack,5,needle_found,1);
  UnityAssertEqualNumber
            ((UNITY_INT)pvVar1,(UNITY_INT)haystack,"Needle was not found in haystack!",0x34,
             UNITY_DISPLAY_STYLE_INT);
  needle_not_found[0] = 'e';
  needle_not_found[1] = '\0';
  needlelen = strlen(needle_not_found);
  pvVar1 = cio_memmem(haystack,5,needle_not_found,needlelen);
  UnityAssertEqualNumber
            (0,(UNITY_INT)pvVar1,"Needle was found in haystack!",0x38,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_cio_memmem(void)
{
	const char haystack[] = "abcd";
	const char needle_found[] = "a";

	const void *found = cio_memmem(haystack, sizeof(haystack), needle_found, strlen(needle_found));
	TEST_ASSERT_EQUAL_MESSAGE(found, haystack, "Needle was not found in haystack!");

	char needle_not_found[] = "e";
	found = cio_memmem(haystack, sizeof(haystack), needle_not_found, strlen(needle_not_found));
	TEST_ASSERT_EQUAL_MESSAGE(NULL, found, "Needle was found in haystack!");
}